

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDVertex::ReplaceFaceInArray(ON_SubDVertex *this,ON_SubDFace *old_face,ON_SubDFace *new_face)

{
  ushort uVar1;
  uint uVar2;
  uint local_3c;
  uint local_2c;
  uint c;
  uint vfi;
  ON_SubDFace *new_face_local;
  ON_SubDFace *old_face_local;
  ON_SubDVertex *this_local;
  
  if ((old_face == (ON_SubDFace *)0x0) || (old_face == new_face)) {
    local_3c = 0xffffffff;
  }
  else {
    local_3c = FaceArrayIndex(this,old_face);
  }
  local_2c = local_3c;
  if (local_3c == 0xffffffff) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    if (new_face == (ON_SubDFace *)0x0) {
      uVar1 = this->m_face_count;
      this->m_face_count = uVar1 - 1;
      while (uVar2 = local_2c + 1, uVar2 < uVar1) {
        this->m_faces[local_2c] = this->m_faces[uVar2];
        local_2c = uVar2;
      }
    }
    else {
      this->m_faces[local_3c] = new_face;
      uVar2 = local_2c;
    }
    local_2c = uVar2;
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDVertex::ReplaceFaceInArray(const ON_SubDFace * old_face, const ON_SubDFace * new_face)
{
  unsigned vfi = (nullptr != old_face && old_face != new_face) ? FaceArrayIndex(old_face) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == vfi)
    return ON_UNSET_UINT_INDEX;
  if (nullptr != new_face)
  {
    m_faces[vfi] = new_face;
  }
  else
  {
    const unsigned c = (unsigned)(m_face_count--);
    while (++vfi < c)
      m_faces[vfi - 1] = m_faces[vfi];
  }
  return vfi;
}